

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_remove_rangeBeyondBounds_fn(int _i)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 10;
  string.capacity = 0x10;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x1219f1;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,0x11);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"0123456789",0xb);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x121a30;
  AString_remove(&string,5,100);
  if (string.capacity == 0x10) {
    uStack_50 = 0x121a4f;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c4);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (string).buffer != NULL";
      pcVar10 = "(void*) (string).buffer";
      iVar1 = 0x1c4;
      goto LAB_00121e7f;
    }
    uStack_50 = 0x121a6c;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1c4);
    pcVar3 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar3 = "(null)";
    }
    else {
      uStack_50 = 0x121a89;
      iVar1 = strcmp("01234",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x121aa2;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x1c4);
        if (string.size == 5) {
          uStack_50 = 0x121ac2;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c4);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar6 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar10 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x1c5;
LAB_00121e7f:
            uStack_50 = 0;
            local_58 = (char *)0x0;
            *(code **)((long)ppcVar6 + -8) = test_AString_remove_zeroRange_fn;
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,iVar1,pcVar4,pcVar3,pcVar8,pcVar10);
          }
          uStack_50 = 0x121ae3;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c5);
          uStack_50 = 0x121afa;
          AString_remove(&string,2,0xffffffffffffffff);
          if (string.capacity != 0x10) {
            iVar1 = 0x1c7;
            goto LAB_00121d51;
          }
          uStack_50 = 0x121b19;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c7);
          if (string.buffer == (char *)0x0) {
            ppcVar6 = &local_58;
            pcVar4 = "Assertion \'_ck_x != NULL\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %#x";
            pcVar8 = "(void*) (string).buffer != NULL";
            pcVar10 = "(void*) (string).buffer";
            iVar1 = 0x1c7;
            goto LAB_00121e7f;
          }
          uStack_50 = 0x121b36;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c7);
          if (string.buffer == (char *)0x0) {
            pcStack_80 = "(null)";
            pcStack_78 = "";
LAB_00121dab:
            uStack_50 = 0;
            local_58 = "\"";
            local_60 = "01";
            local_68 = "\"";
            pcStack_70 = "(\"01\")";
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x1c7,
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                              "(string).buffer == (\"01\")","(string).buffer",pcStack_78);
          }
          uVar2 = (byte)*string.buffer - 0x30;
          if ((uVar2 == 0) && (uVar2 = (byte)string.buffer[1] - 0x31, uVar2 == 0)) {
            uVar2 = (uint)(byte)string.buffer[2];
          }
          if (uVar2 != 0) {
            pcStack_78 = "\"";
            pcStack_80 = string.buffer;
            goto LAB_00121dab;
          }
          uStack_50 = 0x121b77;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1c7);
          if (string.size == 2) {
            uStack_50 = 0x121b97;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x1c7);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              uStack_50 = 0x121bb8;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x1c8);
              uStack_50 = 0x121bc1;
              (*string.deallocator)(string.buffer);
              return;
            }
            ppcVar6 = &local_68;
            local_60 = "(0)";
            local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar10 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x1c8;
            goto LAB_00121e7f;
          }
          local_60 = "strlen(\"01\")";
          pcVar7 = "(string).size == strlen(\"01\")";
          pcVar9 = "(string).size";
          iVar1 = 0x1c7;
          local_58 = (char *)0x2;
          pcVar4 = (char *)string.size;
        }
        else {
          local_60 = "strlen(\"01234\")";
          pcVar7 = "(string).size == strlen(\"01234\")";
          pcVar9 = "(string).size";
          iVar1 = 0x1c4;
          local_58 = (char *)0x5;
          pcVar4 = (char *)string.size;
        }
        goto LAB_00121e32;
      }
      pcVar4 = "\"";
    }
    pcVar10 = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar8 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar7 = "(string).buffer == (\"01234\")";
    pcVar9 = "(string).buffer";
    iVar1 = 0x1c4;
    local_58 = "\"";
    local_60 = "01234";
    local_68 = "\"";
    pcStack_70 = "(\"01234\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar3;
    pcStack_78 = pcVar4;
  }
  else {
    iVar1 = 0x1c4;
LAB_00121d51:
    local_60 = "(16)";
    pcVar9 = "(string).capacity";
    pcVar7 = "(string).capacity == (16)";
    local_58 = (char *)0x10;
    pcVar4 = (char *)string.capacity;
LAB_00121e32:
    pcVar10 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar8 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x121e3b;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,pcVar10,pcVar8,pcVar7,pcVar9);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}